

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linuxaio_request.hpp
# Opt level: O2

void __thiscall
foxxll::linuxaio_request::linuxaio_request
          (linuxaio_request *this,completion_handler *on_complete,file *file,void *buffer,
          offset_type offset,size_type bytes,read_or_write *op)

{
  *(undefined ***)&(this->super_request_with_state).super_request_with_waiters.super_request =
       &PTR___cxa_pure_virtual_00166fe8;
  request_with_state::request_with_state
            (&this->super_request_with_state,&PTR_PTR_00168078,on_complete,file,buffer,offset,bytes,
             *op);
  *(undefined ***)&(this->super_request_with_state).super_request_with_waiters.super_request =
       &PTR_add_waiter_00168018;
  if ((file != (file *)0x0) && (file->_vptr_file == (_func_int **)0x167c18)) {
    return;
  }
  __assert_fail("dynamic_cast<linuxaio_file*>(file)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/stxxl[P]foxxll/foxxll/io/linuxaio_request.hpp"
                ,0x36,
                "foxxll::linuxaio_request::linuxaio_request(const completion_handler &, file *, void *, offset_type, size_type, const read_or_write &)"
               );
}

Assistant:

linuxaio_request(
        const completion_handler& on_complete,
        file* file, void* buffer, offset_type offset, size_type bytes,
        const read_or_write& op)
        : request_with_state(on_complete, file, buffer, offset, bytes, op)
    {
        assert(dynamic_cast<linuxaio_file*>(file));
        TLX_LOG << "linuxaio_request[" << this << "]"
                << " linuxaio_request"
                << "(file=" << file << " buffer=" << buffer
                << " offset=" << offset << " bytes=" << bytes
                << " op=" << op << ")";
    }